

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::OneofWellKnownTypes::set_allocated_empty_field
          (OneofWellKnownTypes *this,Empty *empty_field)

{
  Arena *submessage_arena;
  Arena *message_arena;
  
  message_arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)message_arena & 1) != 0) {
    message_arena = *(Arena **)((ulong)message_arena & 0xfffffffffffffffe);
  }
  clear_oneof_field(this);
  if (empty_field != (Empty *)0x0) {
    submessage_arena =
         (Arena *)(empty_field->super_ZeroFieldsBase).super_Message.super_MessageLite.
                  _internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 1) != 0) {
      submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffe);
    }
    if (message_arena != submessage_arena) {
      empty_field = (Empty *)google::protobuf::internal::GetOwnedMessageInternal
                                       (message_arena,(MessageLite *)empty_field,submessage_arena);
    }
    (this->field_0)._impl_._oneof_case_[0] = 4;
    (this->field_0)._impl_.oneof_field_.any_field_ = (Message *)empty_field;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::set_allocated_empty_field(::google::protobuf::Empty* PROTOBUF_NULLABLE empty_field) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (empty_field) {
    ::google::protobuf::Arena* submessage_arena = reinterpret_cast<::google::protobuf::Message*>(empty_field)->GetArena();
    if (message_arena != submessage_arena) {
      empty_field = ::google::protobuf::internal::GetOwnedMessage(message_arena, empty_field, submessage_arena);
    }
    set_has_empty_field();
    _impl_.oneof_field_.empty_field_ = empty_field;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.OneofWellKnownTypes.empty_field)
}